

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O3

void fillInSwapArray(permInfo *pi)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  swapInfo *x;
  varInfo *pvVar4;
  int *piVar5;
  long lVar6;
  
  iVar3 = pi->totalSwaps;
  uVar1 = pi->varN;
  lVar6 = (long)(int)uVar1;
  x = (swapInfo *)malloc(0x20);
  pvVar4 = (varInfo *)malloc(lVar6 * 8 + 0x10);
  x->posArray = pvVar4;
  piVar5 = (int *)malloc(lVar6 * 4 + 8);
  x->realArray = piVar5;
  x->varN = uVar1;
  *piVar5 = uVar1 + 100;
  if (0 < lVar6) {
    lVar6 = 1;
    do {
      pvVar4[lVar6].position = (int)lVar6;
      pvVar4[lVar6].direction = -1;
      piVar5[lVar6] = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while ((ulong)uVar1 + 1 != lVar6);
  }
  piVar5[(long)(int)uVar1 + 1] = uVar1 + 10;
  iVar2 = nextSwap(x);
  if (iVar2 != 0) {
    lVar6 = (long)iVar3 * 4;
    do {
      lVar6 = lVar6 + -4;
      iVar3 = x->positionToSwap2;
      if (x->positionToSwap1 < x->positionToSwap2) {
        iVar3 = x->positionToSwap1;
      }
      *(int *)((long)pi->swapArray + lVar6) = iVar3;
      iVar3 = nextSwap(x);
    } while (iVar3 != 0);
  }
  free(x->posArray);
  free(x->realArray);
  free(x);
  return;
}

Assistant:

void fillInSwapArray(permInfo* pi)
{
    int counter=pi->totalSwaps-1;
    swapInfo* x= setSwapInfoPtr(pi->varN);
    while(nextSwap(x)==1)
    {
        if(x->positionToSwap1<x->positionToSwap2)
            pi->swapArray[counter--]=x->positionToSwap1;
        else
            pi->swapArray[counter--]=x->positionToSwap2;
    }
    
    freeSwapInfoPtr(x);    
}